

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpNegJ(word *b,word *a,ec_o *ec,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t n;
  size_t n_00;
  
  n_00 = *(size_t *)(in_RDX[3] + 0x30);
  wwCopy(in_RDI,in_RSI,*(size_t *)(in_RDX[3] + 0x30));
  zzNegMod(in_RSI,in_RDX,in_RCX,n_00);
  wwCopy(in_RDI + n_00 * 2,in_RSI + n_00 * 2,*(size_t *)(in_RDX[3] + 0x30));
  return;
}

Assistant:

static void ecpNegJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// xb <- xa
	qrCopy(ecX(b), ecX(a), ec->f);
	// yb <- -ya
	zmNeg(ecY(b, n), ecY(a, n), ec->f);
	// zb <- za
	qrCopy(ecZ(b, n), ecZ(a, n), ec->f);
}